

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lhash_test.cc
# Opt level: O3

unique_ptr<char[],_std::default_delete<char[]>_> anon_unknown.dwarf_7972ae::RandString(void)

{
  int iVar1;
  void *__s;
  __uniq_ptr_impl<char,_std::default_delete<char[]>_> _Var2;
  undefined4 extraout_var;
  uint uVar3;
  undefined8 *in_RDI;
  ulong uVar4;
  ulong uVar5;
  
  iVar1 = rand();
  uVar5 = (ulong)(iVar1 % 3 + 2);
  __s = operator_new__(uVar5);
  uVar4 = 0;
  _Var2._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
  super__Head_base<0UL,_char_*,_false>._M_head_impl =
       (tuple<char_*,_std::default_delete<char[]>_>)memset(__s,0,uVar5);
  *in_RDI = __s;
  uVar3 = iVar1 % 3 + 1;
  if (uVar3 != 0) {
    uVar4 = (ulong)uVar3;
    uVar5 = 0;
    do {
      iVar1 = rand();
      _Var2._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
      super__Head_base<0UL,_char_*,_false>._M_head_impl =
           (tuple<char_*,_std::default_delete<char[]>_>)
           (CONCAT71((int7)(CONCAT44(extraout_var,iVar1) >> 8),(char)iVar1) & 0xffffffffffffff07 |
           0x30);
      *(char *)((long)__s + uVar5) =
           (char)_Var2._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                 super__Head_base<0UL,_char_*,_false>._M_head_impl;
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  *(undefined1 *)((long)__s + uVar4) = 0;
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         _Var2._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
         super__Head_base<0UL,_char_*,_false>._M_head_impl;
}

Assistant:

static std::unique_ptr<char[]> RandString(void) {
  unsigned len = 1 + (rand() % 3);
  auto ret = std::make_unique<char[]>(len + 1);

  for (unsigned i = 0; i < len; i++) {
    ret[i] = '0' + (rand() & 7);
  }
  ret[len] = 0;

  return ret;
}